

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__enum____gl_enumeration
          (ColladaParserAutoGen14Private *this)

{
  byte bVar1;
  bool bVar2;
  UNION__gl_enumeration this_00;
  long in_RDI;
  bool *in_stack_00000008;
  size_t in_stack_00000010;
  bool returnValue;
  UNION__gl_enumeration parameter;
  ParserChar *ptrForErr;
  bool failed;
  ParserChar *in_stack_000000b8;
  ParserChar *in_stack_000000c0;
  StringHash in_stack_000000c8;
  ErrorType in_stack_000000d0;
  Severity in_stack_000000d4;
  ParserTemplateBase *in_stack_000000d8;
  undefined1 local_21;
  undefined1 local_9;
  
  this_00 = toUnion_UNION__gl_enumeration
                      ((ParserChar *)parameter,in_stack_00000010,in_stack_00000008);
  if ((local_9 & 1) == 0) {
    bVar1 = (**(code **)(**(long **)(in_RDI + 0x108) + 0x1ee0))(*(long **)(in_RDI + 0x108),this_00);
  }
  else {
    bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                      (in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000c8,
                       in_stack_000000c0,in_stack_000000b8);
    bVar1 = bVar2 ^ 0xff;
  }
  local_21 = (bool)(bVar1 & 1);
  if (*(long *)(in_RDI + 0x90) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject((StackMemoryManager *)this_00);
  }
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  return local_21;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__enum____gl_enumeration()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__enum____gl_enumeration();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
const ParserChar* ptrForErr = mLastIncompleteFragmentInCharacterData;
DISABLE_WARNING_UNUSED(ptrForErr)
UNION__gl_enumeration parameter = toUnion_UNION__gl_enumeration( mLastIncompleteFragmentInCharacterData, (size_t)(mEndOfDataInCurrentObjectOnStack - mLastIncompleteFragmentInCharacterData), failed );
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__enum____gl_enumeration(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_ENUM, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;

}